

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void reindexTable(Parse *pParse,Table *pTab,char *zColl)

{
  ushort uVar1;
  uint uVar2;
  Index *pIndex;
  i16 *piVar3;
  int iVar4;
  Schema **ppSVar5;
  ulong uVar6;
  Parse *pPVar7;
  
  pIndex = pTab->pIndex;
  do {
    if (pIndex == (Index *)0x0) {
      return;
    }
    if (zColl == (char *)0x0) {
LAB_0017d958:
      if (pTab->pSchema == (Schema *)0x0) {
        uVar6 = 0xfff0bdc0;
      }
      else {
        uVar2 = pParse->db->nDb;
        if ((int)uVar2 < 1) {
          uVar6 = 0;
        }
        else {
          ppSVar5 = &pParse->db->aDb->pSchema;
          uVar6 = 0;
          do {
            if (*ppSVar5 == pTab->pSchema) goto LAB_0017d99b;
            uVar6 = uVar6 + 1;
            ppSVar5 = ppSVar5 + 4;
          } while (uVar2 != uVar6);
          uVar6 = (ulong)uVar2;
        }
      }
LAB_0017d99b:
      pPVar7 = pParse->pToplevel;
      if (pParse->pToplevel == (Parse *)0x0) {
        pPVar7 = pParse;
      }
      sqlite3CodeVerifySchema(pParse,(int)uVar6);
      pPVar7->writeMask = pPVar7->writeMask | 1 << ((byte)uVar6 & 0x1f);
      sqlite3RefillIndex(pParse,pIndex,-1);
    }
    else {
      uVar1 = pIndex->nColumn;
      if ((ulong)uVar1 != 0) {
        piVar3 = pIndex->aiColumn;
        uVar6 = 0;
        do {
          if ((-1 < piVar3[uVar6]) &&
             (iVar4 = sqlite3StrICmp(pIndex->azColl[uVar6],zColl), iVar4 == 0)) goto LAB_0017d958;
          uVar6 = uVar6 + 1;
        } while (uVar1 != uVar6);
      }
    }
    pIndex = pIndex->pNext;
  } while( true );
}

Assistant:

static void reindexTable(Parse *pParse, Table *pTab, char const *zColl){
  Index *pIndex;              /* An index associated with pTab */

  for(pIndex=pTab->pIndex; pIndex; pIndex=pIndex->pNext){
    if( zColl==0 || collationMatch(zColl, pIndex) ){
      int iDb = sqlite3SchemaToIndex(pParse->db, pTab->pSchema);
      sqlite3BeginWriteOperation(pParse, 0, iDb);
      sqlite3RefillIndex(pParse, pIndex, -1);
    }
  }
}